

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeImageCreate
          (ze_context_handle_t hContext,ze_device_handle_t hDevice,ze_image_desc_t *desc,
          ze_image_handle_t *phImage)

{
  ze_image_handle_t p_Var1;
  ze_pfnImageCreate_t pfnCreate;
  ze_result_t result;
  ze_image_handle_t *phImage_local;
  ze_image_desc_t *desc_local;
  ze_device_handle_t hDevice_local;
  ze_context_handle_t hContext_local;
  
  pfnCreate._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c4b0 == (code *)0x0) {
    p_Var1 = (ze_image_handle_t)context_t::get((context_t *)&context);
    *phImage = p_Var1;
  }
  else {
    pfnCreate._4_4_ = (*DAT_0011c4b0)(hContext,hDevice,desc,phImage);
  }
  return pfnCreate._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeImageCreate(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        ze_device_handle_t hDevice,                     ///< [in] handle of the device
        const ze_image_desc_t* desc,                    ///< [in] pointer to image descriptor
        ze_image_handle_t* phImage                      ///< [out] pointer to handle of image object created
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnCreate = context.zeDdiTable.Image.pfnCreate;
        if( nullptr != pfnCreate )
        {
            result = pfnCreate( hContext, hDevice, desc, phImage );
        }
        else
        {
            // generic implementation
            *phImage = reinterpret_cast<ze_image_handle_t>( context.get() );

        }

        return result;
    }